

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O2

void deqp::gles31::bb::anon_unknown_11::copyBufferVarData
               (BufferVarLayoutEntry *dstEntry,BlockDataPtr *dstBlockPtr,
               BufferVarLayoutEntry *srcEntry,BlockDataPtr *srcBlockPtr)

{
  int iVar1;
  int iVar2;
  DataType DVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  void *pvVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  void *__dest;
  void *__src;
  int elementNdx;
  ulong uVar21;
  
  iVar1 = dstEntry->offset;
  pvVar8 = dstBlockPtr->ptr;
  iVar2 = srcEntry->offset;
  pvVar9 = srcBlockPtr->ptr;
  iVar12 = glu::getDataTypeScalarSize(dstEntry->type);
  DVar3 = dstEntry->type;
  uVar10 = dstEntry->arraySize;
  if (dstEntry->arraySize == 0) {
    uVar10 = dstBlockPtr->lastUnsizedArraySize;
  }
  iVar4 = dstEntry->arrayStride;
  uVar11 = dstEntry->topLevelArraySize;
  if (dstEntry->topLevelArraySize == 0) {
    uVar11 = dstBlockPtr->lastUnsizedArraySize;
  }
  iVar5 = dstEntry->topLevelArrayStride;
  iVar6 = srcEntry->arrayStride;
  iVar7 = srcEntry->topLevelArrayStride;
  uVar16 = 0;
  if ((int)uVar10 < 1) {
    uVar10 = 0;
  }
  if ((int)uVar11 < 1) {
    uVar11 = 0;
  }
  for (; uVar16 != uVar11; uVar16 = uVar16 + 1) {
    for (uVar21 = 0; uVar21 != uVar10; uVar21 = uVar21 + 1) {
      __dest = (void *)((long)pvVar8 +
                       (long)(iVar4 * (int)uVar21) + (long)(iVar5 * (int)uVar16) + (long)iVar1);
      __src = (void *)((long)pvVar9 +
                      (long)(iVar6 * (int)uVar21) + (long)(iVar7 * (int)uVar16) + (long)iVar2);
      if (DVar3 - TYPE_DOUBLE_MAT2 < 9 || DVar3 - TYPE_FLOAT_MAT2 < 9) {
        iVar13 = glu::getDataTypeMatrixNumRows(dstEntry->type);
        iVar14 = glu::getDataTypeMatrixNumColumns(dstEntry->type);
        iVar15 = 0;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        if (iVar14 < 1) {
          iVar14 = iVar15;
        }
        for (; iVar15 != iVar14; iVar15 = iVar15 + 1) {
          iVar17 = 0;
          for (iVar18 = 0; iVar13 != iVar18; iVar18 = iVar18 + 1) {
            if (dstEntry->isRowMajor == true) {
              iVar19 = dstEntry->matrixStride * iVar18 + iVar15 * 4;
            }
            else {
              iVar19 = dstEntry->matrixStride * iVar15 + iVar17;
            }
            if (srcEntry->isRowMajor == true) {
              iVar20 = srcEntry->matrixStride * iVar18 + iVar15 * 4;
            }
            else {
              iVar20 = srcEntry->matrixStride * iVar15 + iVar17;
            }
            *(undefined4 *)((long)__dest + (long)iVar19) =
                 *(undefined4 *)((long)__src + (long)iVar20);
            iVar17 = iVar17 + 4;
          }
        }
      }
      else {
        memcpy(__dest,__src,(long)(iVar12 << 2));
      }
    }
  }
  return;
}

Assistant:

void copyBufferVarData (const BufferVarLayoutEntry& dstEntry, const BlockDataPtr& dstBlockPtr, const BufferVarLayoutEntry& srcEntry, const BlockDataPtr& srcBlockPtr)
{
	DE_ASSERT(dstEntry.arraySize <= srcEntry.arraySize);
	DE_ASSERT(dstEntry.topLevelArraySize <= srcEntry.topLevelArraySize);
	DE_ASSERT(dstBlockPtr.lastUnsizedArraySize <= srcBlockPtr.lastUnsizedArraySize);
	DE_ASSERT(dstEntry.type == srcEntry.type);

	deUint8* const			dstBasePtr			= (deUint8*)dstBlockPtr.ptr + dstEntry.offset;
	const deUint8* const	srcBasePtr			= (const deUint8*)srcBlockPtr.ptr + srcEntry.offset;
	const int				scalarSize			= glu::getDataTypeScalarSize(dstEntry.type);
	const bool				isMatrix			= glu::isDataTypeMatrix(dstEntry.type);
	const int				compSize			= sizeof(deUint32);
	const int				dstArraySize		= dstEntry.arraySize == 0 ? dstBlockPtr.lastUnsizedArraySize : dstEntry.arraySize;
	const int				dstArrayStride		= dstEntry.arrayStride;
	const int				dstTopLevelSize		= dstEntry.topLevelArraySize == 0 ? dstBlockPtr.lastUnsizedArraySize : dstEntry.topLevelArraySize;
	const int				dstTopLevelStride	= dstEntry.topLevelArrayStride;
	const int				srcArraySize		= srcEntry.arraySize == 0 ? srcBlockPtr.lastUnsizedArraySize : srcEntry.arraySize;
	const int				srcArrayStride		= srcEntry.arrayStride;
	const int				srcTopLevelSize		= srcEntry.topLevelArraySize == 0 ? srcBlockPtr.lastUnsizedArraySize : srcEntry.topLevelArraySize;
	const int				srcTopLevelStride	= srcEntry.topLevelArrayStride;

	DE_ASSERT(dstArraySize <= srcArraySize && dstTopLevelSize <= srcTopLevelSize);
	DE_UNREF(srcArraySize && srcTopLevelSize);

	for (int topElemNdx = 0; topElemNdx < dstTopLevelSize; topElemNdx++)
	{
		deUint8* const			dstTopPtr	= dstBasePtr + topElemNdx*dstTopLevelStride;
		const deUint8* const	srcTopPtr	= srcBasePtr + topElemNdx*srcTopLevelStride;

		for (int elementNdx = 0; elementNdx < dstArraySize; elementNdx++)
		{
			deUint8* const			dstElemPtr	= dstTopPtr + elementNdx*dstArrayStride;
			const deUint8* const	srcElemPtr	= srcTopPtr + elementNdx*srcArrayStride;

			if (isMatrix)
			{
				const int	numRows	= glu::getDataTypeMatrixNumRows(dstEntry.type);
				const int	numCols	= glu::getDataTypeMatrixNumColumns(dstEntry.type);

				for (int colNdx = 0; colNdx < numCols; colNdx++)
				{
					for (int rowNdx = 0; rowNdx < numRows; rowNdx++)
					{
						deUint8*		dstCompPtr	= dstElemPtr + (dstEntry.isRowMajor ? rowNdx*dstEntry.matrixStride + colNdx*compSize
																						: colNdx*dstEntry.matrixStride + rowNdx*compSize);
						const deUint8*	srcCompPtr	= srcElemPtr + (srcEntry.isRowMajor ? rowNdx*srcEntry.matrixStride + colNdx*compSize
																						: colNdx*srcEntry.matrixStride + rowNdx*compSize);

						DE_ASSERT((deIntptr)(srcCompPtr + compSize) - (deIntptr)srcBlockPtr.ptr <= (deIntptr)srcBlockPtr.size);
						DE_ASSERT((deIntptr)(dstCompPtr + compSize) - (deIntptr)dstBlockPtr.ptr <= (deIntptr)dstBlockPtr.size);
						deMemcpy(dstCompPtr, srcCompPtr, compSize);
					}
				}
			}
			else
			{
				DE_ASSERT((deIntptr)(srcElemPtr + scalarSize*compSize) - (deIntptr)srcBlockPtr.ptr <= (deIntptr)srcBlockPtr.size);
				DE_ASSERT((deIntptr)(dstElemPtr + scalarSize*compSize) - (deIntptr)dstBlockPtr.ptr <= (deIntptr)dstBlockPtr.size);
				deMemcpy(dstElemPtr, srcElemPtr, scalarSize*compSize);
			}
		}
	}
}